

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float128 float128_div_sparc64(float128 a,float128 b,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint32_t bLow;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint64_t aSig1_00;
  ulong uVar11;
  ulong uVar12;
  uint32_t aLow;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  float128 fVar19;
  uint64_t aSig1;
  uint64_t aSig0;
  int32_t bExp;
  int32_t aExp;
  uint64_t bSig1;
  uint64_t bSig0;
  uint64_t local_90;
  ulong local_88;
  int32_t local_7c;
  uint local_78;
  uint local_74;
  ulong local_70;
  float_status *local_68;
  uint64_t local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  aSig1_00 = a.low;
  local_60 = b.low;
  uVar17 = a.high & 0xffffffffffff;
  local_74 = a.high._6_2_ & 0x7fff;
  local_58 = b.high & 0xffffffffffff;
  local_78 = b.high._6_2_ & 0x7fff;
  uVar8 = b.high ^ a.high;
  local_90 = aSig1_00;
  local_88 = uVar17;
  if (local_74 == 0x7fff) {
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
        aSig1_00 == 0) {
      if (local_78 != 0x7fff) goto LAB_00a2bba2;
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          local_60 == 0) goto LAB_00a2bbc3;
    }
LAB_00a2b9db:
    fVar19 = propagateFloat128NaN(a,b,status);
    return fVar19;
  }
  if (((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
    if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
        local_60 == 0) {
      if ((((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0 &&
          aSig1_00 == 0) &&
          ((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0) {
LAB_00a2bbc3:
        status->float_exception_flags = status->float_exception_flags | 1;
        fVar19.high = 0x7fffffffffffffff;
        fVar19.low = 0xffffffffffffffff;
        return fVar19;
      }
      status->float_exception_flags = status->float_exception_flags | 4;
LAB_00a2bba2:
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar8 & 0x8000000000000000 | 0x7fff000000000000;
      return (float128)(auVar1 << 0x40);
    }
    normalizeFloat128Subnormal(local_58,local_60,(int32_t *)&local_78,&local_58,&local_60);
LAB_00a2ba11:
    if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          aSig1_00 == 0) goto LAB_00a2bfd6;
      normalizeFloat128Subnormal(uVar17,aSig1_00,(int32_t *)&local_74,&local_88,&local_90);
    }
    uVar17 = local_90 << 0xf;
    local_88 = local_88 << 0xf | local_90 >> 0x31 | 0x8000000000000000;
    uVar13 = local_60 * 0x8000;
    uVar10 = local_58 << 0xf;
    local_70 = uVar10 | 0x8000000000000000;
    local_50 = local_60 >> 0x31;
    local_58 = local_50 | local_70;
    if ((local_58 < local_88) || (uVar13 <= uVar17 && local_58 == local_88)) {
      local_90 = (local_90 >> 0x31) << 0x3f | uVar17 >> 1;
      local_88 = local_88 >> 1;
      local_7c = (local_74 - local_78) + 0x3ffe;
    }
    else {
      local_7c = (local_74 - local_78) + 0x3ffd;
      local_90 = uVar17;
    }
    uVar17 = 0xffffffffffffffff;
    if (local_88 < local_58) {
      uVar11 = local_70 >> 0x20;
      uVar6 = uVar10 & 0xffffffff00000000 | 0x8000000000000000;
      uVar12 = 0xffffffff00000000;
      if (local_88 < uVar6) {
        uVar12 = local_88 / uVar11 << 0x20;
      }
      uVar14 = (local_50 | uVar10 & 0xffffffff) * (uVar12 >> 0x20);
      uVar3 = uVar12 * local_58;
      uVar17 = local_90 - uVar3;
      lVar4 = ((local_88 - ((uVar14 >> 0x20) + (uVar12 >> 0x20) * uVar11)) -
              (ulong)(local_90 < uVar3)) - (ulong)(uVar3 < uVar14 << 0x20);
      if (lVar4 < 0) {
        uVar3 = (0x100000000 - uVar12) * local_58 + local_90;
        uVar14 = uVar17;
        do {
          uVar12 = uVar12 - 0x100000000;
          uVar17 = uVar14 + (local_58 << 0x20);
          bVar18 = uVar3 < uVar14;
          uVar3 = uVar3 + (local_58 << 0x20);
          lVar4 = lVar4 + uVar11 + (ulong)bVar18;
          uVar14 = uVar17;
        } while (lVar4 < 0);
      }
      uVar17 = uVar17 >> 0x20 | lVar4 << 0x20;
      if (uVar17 < uVar6) {
        uVar17 = uVar17 / uVar11;
      }
      else {
        uVar17 = 0xffffffff;
      }
      uVar17 = uVar17 | uVar12;
    }
    local_40 = uVar13 >> 0x20;
    uVar6 = uVar17 >> 0x20;
    local_48 = uVar13 & 0xffffffff;
    uVar11 = (uVar17 & 0xffffffff) * local_40;
    uVar12 = uVar11 + uVar6 * local_48;
    local_38 = 0;
    if (CARRY8(uVar11,uVar6 * local_48)) {
      local_38 = 0x100000000;
    }
    uVar11 = uVar17 * uVar13;
    local_70 = local_70 >> 0x20;
    local_50 = local_50 | uVar10 & 0xffffffff;
    uVar3 = (uVar17 & 0xffffffff) * local_70;
    uVar14 = uVar3 + uVar6 * local_50;
    lVar4 = 0;
    if (CARRY8(uVar3,uVar6 * local_50)) {
      lVar4 = -0x100000000;
    }
    uVar7 = uVar17 * local_58;
    uVar5 = uVar6 * local_40 + uVar7 + (uVar12 >> 0x20) + local_38 +
            (ulong)(uVar11 < uVar12 << 0x20);
    uVar12 = -uVar11;
    uVar3 = (local_90 - uVar5) - (ulong)(uVar11 != 0);
    lVar4 = (((((local_88 - ((uVar14 >> 0x20) + uVar6 * local_70)) + lVar4) -
              (ulong)(uVar7 < uVar14 << 0x20)) - (ulong)(uVar5 < uVar7)) - (ulong)(local_90 < uVar5)
            ) - (ulong)(local_90 - uVar5 < (ulong)(uVar11 != 0));
    if (lVar4 < 0) {
      uVar6 = (uVar17 * -0x8000 + 0x8000) * local_60;
      do {
        uVar17 = uVar17 - 1;
        bVar18 = CARRY8(uVar3,local_58);
        uVar11 = uVar3 + local_58;
        uVar3 = uVar11 + (uVar6 < uVar12);
        lVar4 = lVar4 + (ulong)bVar18 + (ulong)CARRY8(uVar11,(ulong)(uVar6 < uVar12));
        uVar12 = uVar12 + uVar13;
        uVar6 = uVar6 + uVar13;
      } while (lVar4 < 0);
    }
    uVar6 = 0xffffffffffffffff;
    if (uVar3 < local_58) {
      uVar11 = 0xffffffff00000000;
      uVar10 = uVar10 & 0xffffffff00000000 | 0x8000000000000000;
      if (uVar3 < uVar10) {
        uVar11 = uVar3 / local_70 << 0x20;
      }
      uVar5 = (uVar11 >> 0x20) * local_50;
      uVar14 = uVar11 * local_58;
      uVar6 = uVar12 - uVar14;
      lVar4 = ((uVar3 - ((uVar5 >> 0x20) + (uVar11 >> 0x20) * local_70)) - (ulong)(uVar12 < uVar14))
              - (ulong)(uVar14 < uVar5 << 0x20);
      if (lVar4 < 0) {
        uVar14 = (0x100000000 - uVar11) * local_58 + uVar12;
        uVar5 = uVar6;
        do {
          uVar11 = uVar11 - 0x100000000;
          uVar6 = uVar5 + (local_58 << 0x20);
          bVar18 = uVar14 < uVar5;
          uVar14 = uVar14 + (local_58 << 0x20);
          lVar4 = lVar4 + local_70 + (ulong)bVar18;
          uVar5 = uVar6;
        } while (lVar4 < 0);
      }
      uVar6 = uVar6 >> 0x20 | lVar4 << 0x20;
      if (uVar6 < uVar10) {
        uVar6 = uVar6 / local_70;
      }
      else {
        uVar6 = 0xffffffff;
      }
      uVar6 = uVar6 | uVar11;
    }
    if (((uint)uVar6 & 0x3fff) < 5) {
      uVar14 = uVar6 >> 0x20;
      uVar10 = (uVar6 & 0xffffffff) * local_40;
      uVar11 = uVar10 + local_48 * uVar14;
      lVar4 = 0x100000000;
      if (!CARRY8(uVar10,local_48 * uVar14)) {
        lVar4 = 0;
      }
      uVar5 = (uVar6 & 0xffffffff) * local_70;
      uVar10 = uVar6 * uVar13;
      uVar7 = uVar5 + local_50 * uVar14;
      lVar9 = -0x100000000;
      if (!CARRY8(uVar5,local_50 * uVar14)) {
        lVar9 = 0;
      }
      uVar5 = uVar6 * local_58;
      uVar16 = local_40 * uVar14 + uVar5 + (uVar11 >> 0x20) + lVar4 +
               (ulong)(uVar10 < uVar11 << 0x20);
      uVar11 = -uVar10;
      uVar15 = (uVar12 - uVar16) - (ulong)(uVar10 != 0);
      lVar4 = (((((uVar3 - ((uVar7 >> 0x20) + uVar14 * local_70)) + lVar9) -
                (ulong)(uVar5 < uVar7 << 0x20)) - (ulong)(uVar16 < uVar5)) -
              (ulong)(uVar12 < uVar16)) - (ulong)(uVar12 - uVar16 < (ulong)(uVar10 != 0));
      if (lVar4 < 0) {
        local_60 = local_60 * (uVar6 * -0x8000 + 0x8000);
        do {
          uVar6 = uVar6 - 1;
          bVar18 = CARRY8(uVar15,local_58);
          uVar10 = uVar15 + local_58;
          uVar15 = uVar10 + (local_60 < uVar11);
          lVar4 = lVar4 + (ulong)bVar18 + (ulong)CARRY8(uVar10,(ulong)(local_60 < uVar11));
          uVar11 = uVar11 + uVar13;
          local_60 = local_60 + uVar13;
        } while (lVar4 < 0);
      }
      uVar6 = uVar6 | ((lVar4 != 0 || uVar15 != 0) || uVar11 != 0);
    }
    local_68 = status;
    local_60 = uVar13;
    fVar19 = roundAndPackFloat128
                       ((byte)(uVar8 >> 0x3f),local_7c,uVar17 >> 0xf,uVar17 << 0x31 | uVar6 >> 0xf,
                        uVar6 << 0x31,status);
  }
  else {
    if (local_78 != 0x7fff) goto LAB_00a2ba11;
    if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        local_60 != 0) goto LAB_00a2b9db;
LAB_00a2bfd6:
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar8 & 0x8000000000000000;
    fVar19 = (float128)(auVar2 << 0x40);
  }
  return fVar19;
}

Assistant:

float128 float128_div(float128 a, float128 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig0, aSig1, bSig0, bSig1, zSig0, zSig1, zSig2;
    uint64_t rem0, rem1, rem2, rem3, term0, term1, term2, term3;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    bSign = extractFloat128Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if (aSig0 | aSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        if ( bExp == 0x7FFF ) {
            if (bSig0 | bSig1) {
                return propagateFloat128NaN(a, b, status);
            }
            goto invalid;
        }
        return packFloat128( zSign, 0x7FFF, 0, 0 );
    }
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        return packFloat128( zSign, 0, 0, 0 );
    }
    if ( bExp == 0 ) {
        if ( ( bSig0 | bSig1 ) == 0 ) {
            if ( ( aExp | aSig0 | aSig1 ) == 0 ) {
 invalid:
                float_raise(float_flag_invalid, status);
                return float128_default_nan(status);
            }
            float_raise(float_flag_divbyzero, status);
            return packFloat128( zSign, 0x7FFF, 0, 0 );
        }
        normalizeFloat128Subnormal( bSig0, bSig1, &bExp, &bSig0, &bSig1 );
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloat128( zSign, 0, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    zExp = aExp - bExp + 0x3FFD;
    shortShift128Left(
        aSig0 | UINT64_C(0x0001000000000000), aSig1, 15, &aSig0, &aSig1 );
    shortShift128Left(
        bSig0 | UINT64_C(0x0001000000000000), bSig1, 15, &bSig0, &bSig1 );
    if ( le128( bSig0, bSig1, aSig0, aSig1 ) ) {
        shift128Right( aSig0, aSig1, 1, &aSig0, &aSig1 );
        ++zExp;
    }
    zSig0 = estimateDiv128To64( aSig0, aSig1, bSig0 );
    mul128By64To192( bSig0, bSig1, zSig0, &term0, &term1, &term2 );
    sub192( aSig0, aSig1, 0, term0, term1, term2, &rem0, &rem1, &rem2 );
    while ( (int64_t) rem0 < 0 ) {
        --zSig0;
        add192( rem0, rem1, rem2, 0, bSig0, bSig1, &rem0, &rem1, &rem2 );
    }
    zSig1 = estimateDiv128To64( rem1, rem2, bSig0 );
    if ( ( zSig1 & 0x3FFF ) <= 4 ) {
        mul128By64To192( bSig0, bSig1, zSig1, &term1, &term2, &term3 );
        sub192( rem1, rem2, 0, term1, term2, term3, &rem1, &rem2, &rem3 );
        while ( (int64_t) rem1 < 0 ) {
            --zSig1;
            add192( rem1, rem2, rem3, 0, bSig0, bSig1, &rem1, &rem2, &rem3 );
        }
        zSig1 |= ( ( rem1 | rem2 | rem3 ) != 0 );
    }
    shift128ExtraRightJamming( zSig0, zSig1, 0, 15, &zSig0, &zSig1, &zSig2 );
    return roundAndPackFloat128(zSign, zExp, zSig0, zSig1, zSig2, status);

}